

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O1

int pointInCircle(DelaunayTriangulation *delTri,GLsizei i_p,GLsizei i_a,GLsizei i_b,GLsizei i_c)

{
  GLfloat (*paGVar1) [2];
  float fVar2;
  
  paGVar1 = delTri->points;
  fVar2 = incircle(paGVar1[i_a],paGVar1[i_b],paGVar1[i_c],paGVar1[i_p]);
  return (int)(0.0 < fVar2);
}

Assistant:

int pointInCircle(DelaunayTriangulation *delTri, GLsizei i_p, GLsizei i_a, GLsizei i_b, GLsizei i_c) {
    // https://www.cs.cmu.edu/~quake/robust.html
	GLfloat *point, *a, *b, *c;
	point = delTri->points[i_p];
	a = delTri->points[i_a];
	b = delTri->points[i_b];
	c = delTri->points[i_c];

#if ROBUST
	return incircle(a, b, c, point) > 0;
#else

    GLfloat a1, a2, a3, b1, b2, b3, c1, c2, c3, det;

	a1 = a[0] - point[0]; a2 = a[1] - point[1];
	b1 = b[0] - point[0]; b2 = b[1] - point[1];
	c1 = c[0] - point[0]; c2 = c[1] - point[1];

	a3 = a1 * a1 + a2 * a2;
	b3 = b1 * b1 + b2 * b2;
	c3 = c1 * c1 + c2 * c2;

	det = a1*b2*c3 + a2*b3*c1 + a3*b1*c2 - (a3*b2*c1 + a1*b3*c2 + a2*b1*c3);
    return det < 0;
#endif
}